

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813_9.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementHexaANCF_3813_9::ShapeFunctionsDerivativeX
          (ChElementHexaANCF_3813_9 *this,ShapeVector *Nx,double x,double y,double z)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  double dVar11;
  undefined1 auVar12 [16];
  
  dVar1 = (this->m_dimensions).m_data[0];
  dVar11 = 0.25 / dVar1;
  dVar2 = y + 1.0;
  auVar7._8_8_ = dVar2;
  auVar7._0_8_ = dVar2;
  auVar7._16_8_ = dVar2;
  auVar7._24_8_ = dVar2;
  auVar5 = vpermi2pd_avx512f(_DAT_0099d840,ZEXT864((ulong)(1.0 - z)),
                             ZEXT1664(CONCAT88(z + 1.0,z + 1.0)));
  auVar9._8_8_ = dVar11;
  auVar9._0_8_ = dVar11;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = 1.0 - y;
  auVar12 = vunpcklpd_avx(auVar12,auVar9);
  auVar3._8_8_ = 0x8000000000000000;
  auVar3._0_8_ = 0x8000000000000000;
  auVar3 = vxorpd_avx512vl(auVar9,auVar3);
  auVar10._16_16_ = auVar3;
  auVar10._0_16_ = auVar12;
  auVar4 = vpermi2pd_avx512vl(_DAT_00998680,auVar10,auVar7);
  auVar7 = vpermpd_avx2(auVar10,0xd4);
  auVar8._0_8_ = auVar7._0_8_ * auVar4._0_8_;
  auVar8._8_8_ = auVar7._8_8_ * auVar4._8_8_;
  auVar8._16_8_ = auVar7._16_8_ * auVar4._16_8_;
  auVar8._24_8_ = auVar7._24_8_ * auVar4._24_8_;
  auVar6 = vinsertf64x4_avx512f(ZEXT3264(auVar8),auVar8,1);
  auVar5 = vmulpd_avx512f(auVar5,auVar6);
  *(undefined1 (*) [64])
   (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.array =
       auVar5;
  (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.array[8] =
       dVar1 * x * 0.5;
  (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.array[9] =
       0.0;
  (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.array[10] =
       0.0;
  return;
}

Assistant:

void ChElementHexaANCF_3813_9::ShapeFunctionsDerivativeX(ShapeVector& Nx, double x, double y, double z) {
    double a = GetDimensions().x();
    Nx(0) = 0.25 / a * (-1) * (1 - y) * (1 - z);
    Nx(1) = 0.25 / a * (+1) * (1 - y) * (1 - z);
    Nx(2) = 0.25 / a * (+1) * (1 + y) * (1 - z);
    Nx(3) = 0.25 / a * (-1) * (1 + y) * (1 - z);
    Nx(4) = 0.25 / a * (-1) * (1 - y) * (1 + z);
    Nx(5) = 0.25 / a * (+1) * (1 - y) * (1 + z);
    Nx(6) = 0.25 / a * (+1) * (1 + y) * (1 + z);
    Nx(7) = 0.25 / a * (-1) * (1 + y) * (1 + z);
    //
    Nx(8) = a * x * (1.0 / 2.0);
    Nx(9) = 0;
    Nx(10) = 0;
}